

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

void __thiscall
dd::ProcessThreadImpl::RegisterModule(ProcessThreadImpl *this,Module *module,Location *from)

{
  bool bVar1;
  value_type local_48;
  
  bVar1 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (bVar1) {
    if ((this->_thread)._M_t.
        super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
        super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
        super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl != (PlatformThread *)0x0) {
      (*module->_vptr_Module[2])(module,this);
    }
    pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
    local_48.next_callback = 0;
    local_48.location._function_name = from->_function_name;
    local_48.location._file_name = from->_file_name;
    local_48.location._line_number = from->_line_number;
    local_48.location._20_4_ = *(undefined4 *)&from->field_0x14;
    local_48.module = module;
    std::__cxx11::
    list<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
    ::push_back(&this->_modules,&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
    Event::Set(&this->_wake_up);
    return;
  }
  __assert_fail("_thread_checker.IsCurrent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x6c,
                "virtual void dd::ProcessThreadImpl::RegisterModule(Module *, const Location &)");
}

Assistant:

void ProcessThreadImpl::RegisterModule(Module* module, const Location& from) {
		assert(_thread_checker.IsCurrent());
		if (_thread.get())
			module->ProcessThreadAttached(this);
		{
			AutoLock l(_lock);
			_modules.push_back(ModuleCallback(module, from));
		}
		_wake_up.Set();
	}